

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O3

void add_linear_comb_weighted<double,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
               (size_t *ix_arr,size_t st,size_t end,double *res,double *x,double *coef,double x_sd,
               double x_mean,double *fill_val,MissingAction missing_action,double *buffer_arr,
               size_t *buffer_NAs,bool first_run,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w)

{
  undefined1 auVar1 [16];
  pointer __first;
  pointer __last;
  size_t row;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  double *pdVar7;
  size_t row_1;
  size_t *key;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar14;
  vector<double,_std::allocator<double>_> obs_weight;
  tuple<> local_b1;
  double local_b0;
  size_type local_a8;
  double local_a0;
  long local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  double *local_58;
  double *local_50;
  size_t local_48;
  double local_40;
  double local_38;
  
  local_a0 = x_mean;
  local_48 = end;
  if (first_run) {
    *coef = *coef / x_sd;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (missing_action != Fail) {
      local_50 = buffer_arr;
      local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (unsigned_long *)0x0;
      std::vector<double,_std::allocator<double>_>::resize
                (&local_78,(end - st) + 1,(value_type_conflict *)&local_90);
      if (end < st) {
        local_b0 = 0.0;
        local_a8 = 0;
        lVar6 = 0;
      }
      else {
        key = ix_arr + st;
        local_b0 = 0.0;
        local_a8 = 0;
        local_98 = 0;
        sVar5 = st;
        pdVar7 = res;
        local_58 = coef;
        do {
          if ((ulong)ABS(x[*key]) < 0x7ff0000000000000) {
            local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = key;
            pVar14 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_90,&local_b1);
            local_38 = *(double *)((pVar14.first.m_bucket.m_bucket)->m_value + 8);
            local_40 = x[*key];
            dVar8 = fma(local_40 - local_a0,*local_58,*pdVar7);
            *pdVar7 = dVar8;
            local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[local_a8] = local_38;
            local_50[local_a8] = local_40;
            local_a8 = local_a8 + 1;
            local_b0 = local_b0 + local_38;
            end = local_48;
          }
          else {
            buffer_NAs[local_98] = sVar5;
            local_98 = local_98 + 1;
          }
          sVar5 = sVar5 + 1;
          pdVar7 = pdVar7 + 1;
          key = key + 1;
        } while (sVar5 <= end);
        local_b0 = local_b0 * 0.5;
        lVar6 = local_98;
        coef = local_58;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_90,local_a8,(allocator_type *)&local_b1);
      __last = local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      __first = local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      auVar1 = _DAT_0036e1f0;
      pdVar7 = local_50;
      if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar2 = ((long)local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start) - 8;
        auVar13._8_4_ = (int)uVar2;
        auVar13._0_8_ = uVar2;
        auVar13._12_4_ = (int)(uVar2 >> 0x20);
        auVar9._0_8_ = uVar2 >> 3;
        auVar9._8_8_ = auVar13._8_8_ >> 3;
        uVar4 = 0;
        auVar9 = auVar9 ^ _DAT_0036e1f0;
        auVar11 = _DAT_0036e1e0;
        do {
          auVar13 = auVar11 ^ auVar1;
          if ((bool)(~(auVar13._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar13._0_4_ ||
                      auVar9._4_4_ < auVar13._4_4_) & 1)) {
            local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4] = uVar4;
          }
          if ((auVar13._12_4_ != auVar9._12_4_ || auVar13._8_4_ <= auVar9._8_4_) &&
              auVar13._12_4_ <= auVar9._12_4_) {
            local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4 + 1] = uVar4 + 1;
          }
          uVar4 = uVar4 + 2;
          lVar3 = auVar11._8_8_;
          auVar11._0_8_ = auVar11._0_8_ + 2;
          auVar11._8_8_ = lVar3 + 2;
        } while (((uVar2 >> 3) + 2 & 0xfffffffffffffffe) != uVar4);
        uVar2 = (long)local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar3 = 0x3f;
        if (uVar2 != 0) {
          for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<add_linear_comb_weighted<double,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>(unsigned_long_const*,unsigned_long,unsigned_long,double*,double_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                   (ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_mult_hpp:627:19)>
                    )&buffer_arr);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<add_linear_comb_weighted<double,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>(unsigned_long_const*,unsigned_long,unsigned_long,double*,double_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )__first,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )__last,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_mult_hpp:627:19)>
                             )&buffer_arr);
        pdVar7 = buffer_arr;
      }
      dVar8 = pdVar7[local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1]];
      *fill_val = dVar8;
      if (local_a8 != 0) {
        dVar10 = 0.0;
        uVar2 = 0;
        do {
          dVar10 = dVar10 + local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start
                            [local_90.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar2]];
          if (local_b0 <= dVar10) {
            dVar8 = pdVar7[local_90.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar2]];
            if (((dVar10 == local_b0) && (!NAN(dVar10) && !NAN(local_b0))) && (uVar2 < local_a8 - 1)
               ) {
              dVar8 = dVar8 + (pdVar7[local_90.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar2 + 1]] - dVar8)
                              * 0.5;
            }
            *fill_val = dVar8;
            break;
          }
          uVar2 = uVar2 + 1;
        } while (local_a8 != uVar2);
      }
      dVar8 = (dVar8 - local_a0) * *coef;
      *fill_val = dVar8;
      if ((lVar6 != 0) && ((dVar8 != 0.0 || (NAN(dVar8))))) {
        lVar3 = 0;
        do {
          res[buffer_NAs[lVar3] - st] = res[buffer_NAs[lVar3] - st] + dVar8;
          lVar3 = lVar3 + 1;
        } while (lVar6 != lVar3);
      }
      if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
        operator_delete(local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_0018c62d;
    }
  }
  else {
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (missing_action != Fail) {
      if (st <= end) {
        dVar8 = *fill_val;
        dVar10 = *coef;
        do {
          dVar12 = dVar8;
          if ((ulong)ABS(x[ix_arr[st]]) < 0x7ff0000000000000) {
            dVar12 = (x[ix_arr[st]] - x_mean) * dVar10;
          }
          *res = dVar12 + *res;
          st = st + 1;
          res = res + 1;
        } while (st <= end);
      }
      goto LAB_0018c62d;
    }
  }
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  if (st <= end) {
    local_b0 = *coef;
    sVar5 = st;
    do {
      dVar8 = fma(x[ix_arr[sVar5]] - local_a0,local_b0,res[sVar5 - st]);
      res[sVar5 - st] = dVar8;
      sVar5 = sVar5 + 1;
    } while (sVar5 <= local_48);
  }
LAB_0018c62d:
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void add_linear_comb_weighted(const size_t ix_arr[], size_t st, size_t end, double *restrict res,
                              const real_t_ *restrict x, double &coef, double x_sd, double x_mean, double &restrict fill_val,
                              MissingAction missing_action, double *restrict buffer_arr,
                              size_t *restrict buffer_NAs, bool first_run, mapping &restrict w)
{
    /* TODO: here don't need the buffer for NAs */

    if (first_run)
        coef /= x_sd;

    size_t cnt = 0;
    size_t cnt_NA = 0;
    double *restrict res_write = res - st;
    ldouble_safe cumw = 0;
    double w_this;
    /* TODO: these buffers should be allocated externally */
    std::vector<double> obs_weight;

    if (first_run && missing_action != Fail)
    {
        obs_weight.resize(end - st + 1, 0.);
    }

    if (missing_action == Fail)
    {    
        for (size_t row = st; row <= end; row++)
            res_write[row] = std::fma(x[ix_arr[row]] - x_mean, coef, res_write[row]);
    }

    else
    {
        if (first_run)
        {
            for (size_t row = st; row <= end; row++)
            {
                if (likely(!is_na_or_inf(x[ix_arr[row]])))
                {
                    w_this = w[ix_arr[row]];
                    res_write[row]     = std::fma(x[ix_arr[row]] - x_mean, coef, res_write[row]);
                    obs_weight[cnt]    = w_this;
                    buffer_arr[cnt++]  = x[ix_arr[row]];
                    cumw += w_this;
                }

                else
                {
                    buffer_NAs[cnt_NA++] = row;
                }

            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                res_write[row] += (is_na_or_inf(x[ix_arr[row]]))? fill_val : ( (x[ix_arr[row]]-x_mean) * coef );
            }
            return;
        }


        ldouble_safe mid_point = cumw / (ldouble_safe)2;
        std::vector<size_t> sorted_ix(cnt);
        std::iota(sorted_ix.begin(), sorted_ix.end(), (size_t)0);
        std::sort(sorted_ix.begin(), sorted_ix.end(),
                  [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
        ldouble_safe currw = 0;
        fill_val = buffer_arr[sorted_ix.back()]; /* <- will overwrite later */
        /* TODO: is this median calculation correct? should it do a weighted interpolation? */
        for (size_t ix = 0; ix < cnt; ix++)
        {
            currw += obs_weight[sorted_ix[ix]];
            if (currw >= mid_point)
            {
                if (currw == mid_point && ix < cnt-1)
                    fill_val = buffer_arr[sorted_ix[ix]] + (buffer_arr[sorted_ix[ix+1]] - buffer_arr[sorted_ix[ix]]) / 2.0;
                else
                    fill_val = buffer_arr[sorted_ix[ix]];
                break;
            }
        }

        fill_val = (fill_val - x_mean) * coef;
        if (cnt_NA && fill_val)
        {
            for (size_t row = 0; row < cnt_NA; row++)
                res_write[buffer_NAs[row]] += fill_val;
        }

    }
}